

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O1

void __thiscall QUndoGroup::setActiveStack(QUndoGroup *this,QUndoStack *stack)

{
  long lVar1;
  QObject *pQVar2;
  bool bVar3;
  char *pcVar4;
  int __c;
  QMetaObject *__s;
  long in_FS_OFFSET;
  QObject aQStack_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QString local_68;
  void *local_48;
  QString *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  pQVar2 = *(QObject **)(lVar1 + 0x78);
  if (pQVar2 != &stack->super_QObject) {
    if (pQVar2 != (QObject *)0x0) {
      QObject::disconnect(pQVar2,"2canUndoChanged(bool)",&this->super_QObject,
                          "2canUndoChanged(bool)");
      QObject::disconnect(*(QObject **)(lVar1 + 0x78),"2undoTextChanged(QString)",
                          &this->super_QObject,"2undoTextChanged(QString)");
      QObject::disconnect(*(QObject **)(lVar1 + 0x78),"2canRedoChanged(bool)",&this->super_QObject,
                          "2canRedoChanged(bool)");
      QObject::disconnect(*(QObject **)(lVar1 + 0x78),"2redoTextChanged(QString)",
                          &this->super_QObject,"2redoTextChanged(QString)");
      QObject::disconnect(*(QObject **)(lVar1 + 0x78),"2indexChanged(int)",&this->super_QObject,
                          "2indexChanged(int)");
      QObject::disconnect(*(QObject **)(lVar1 + 0x78),"2cleanChanged(bool)",&this->super_QObject,
                          "2cleanChanged(bool)");
    }
    *(QUndoStack **)(lVar1 + 0x78) = stack;
    if (stack == (QUndoStack *)0x0) {
      local_68.d.ptr = (char16_t *)&local_48;
      local_48 = (void *)((ulong)local_48 & 0xffffffffffffff00);
      local_68.d.d = (Data *)0x0;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,3,(void **)&local_68);
      local_68.d.size = 0;
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char16_t *)0x0;
      local_48 = (void *)0x0;
      pQStack_40 = &local_68;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,5,&local_48);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_48 = (void *)((ulong)local_48 & 0xffffffffffffff00);
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char16_t *)&local_48;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,4,(void **)&local_68);
      local_68.d.size = 0;
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char16_t *)0x0;
      local_48 = (void *)0x0;
      pQStack_40 = &local_68;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,6,&local_48);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_48 = (void *)CONCAT71(local_48._1_7_,1);
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char16_t *)&local_48;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,2,(void **)&local_68);
      local_48 = (void *)((ulong)local_48 & 0xffffffff00000000);
    }
    else {
      QObject::connect(local_70,(char *)stack,(QObject *)"2canUndoChanged(bool)",(char *)this,
                       0x6d6709);
      QMetaObject::Connection::~Connection((Connection *)local_70);
      QObject::connect(local_78,*(char **)(lVar1 + 0x78),(QObject *)"2undoTextChanged(QString)",
                       (char *)this,0x6d671f);
      QMetaObject::Connection::~Connection((Connection *)local_78);
      QObject::connect(local_80,*(char **)(lVar1 + 0x78),(QObject *)"2canRedoChanged(bool)",
                       (char *)this,0x6d6739);
      QMetaObject::Connection::~Connection((Connection *)local_80);
      QObject::connect(local_88,*(char **)(lVar1 + 0x78),(QObject *)"2redoTextChanged(QString)",
                       (char *)this,0x6d674f);
      QMetaObject::Connection::~Connection((Connection *)local_88);
      QObject::connect(local_90,*(char **)(lVar1 + 0x78),(QObject *)"2indexChanged(int)",
                       (char *)this,0x6d6769);
      QMetaObject::Connection::~Connection((Connection *)local_90);
      QObject::connect(aQStack_98,*(char **)(lVar1 + 0x78),(QObject *)"2cleanChanged(bool)",
                       (char *)this,0x6d677c);
      QMetaObject::Connection::~Connection((Connection *)aQStack_98);
      bVar3 = QUndoStack::canUndo(*(QUndoStack **)(lVar1 + 0x78));
      local_68.d.ptr = (char16_t *)&local_48;
      local_48 = (void *)CONCAT71(local_48._1_7_,bVar3);
      local_68.d.d = (Data *)0x0;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,3,(void **)&local_68);
      QUndoStack::undoText(&local_68,*(QUndoStack **)(lVar1 + 0x78));
      local_48 = (void *)0x0;
      pQStack_40 = &local_68;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,5,&local_48);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      bVar3 = QUndoStack::canRedo(*(QUndoStack **)(lVar1 + 0x78));
      local_48 = (void *)CONCAT71(local_48._1_7_,bVar3);
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char16_t *)&local_48;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,4,(void **)&local_68);
      QUndoStack::redoText(&local_68,*(QUndoStack **)(lVar1 + 0x78));
      local_48 = (void *)0x0;
      pQStack_40 = &local_68;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,6,&local_48);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      bVar3 = QUndoStack::isClean(*(QUndoStack **)(lVar1 + 0x78));
      local_48 = (void *)CONCAT71(local_48._1_7_,bVar3);
      local_68.d.d = (Data *)0x0;
      __s = &staticMetaObject;
      local_68.d.ptr = (char16_t *)&local_48;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,2,(void **)&local_68);
      pcVar4 = QUndoStack::index(*(QUndoStack **)(lVar1 + 0x78),(char *)__s,__c);
      local_48 = (void *)CONCAT44(local_48._4_4_,(int)pcVar4);
    }
    local_68.d.ptr = (char16_t *)&local_48;
    local_68.d.d = (Data *)0x0;
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,1,(void **)&local_68);
    local_48 = *(void **)(lVar1 + 0x78);
    local_68.d.ptr = (char16_t *)&local_48;
    local_68.d.d = (Data *)0x0;
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,(void **)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoGroup::setActiveStack(QUndoStack *stack)
{
    Q_D(QUndoGroup);
    if (d->active == stack)
        return;

    if (d->active != nullptr) {
        disconnect(d->active, SIGNAL(canUndoChanged(bool)),
                    this, SIGNAL(canUndoChanged(bool)));
        disconnect(d->active, SIGNAL(undoTextChanged(QString)),
                    this, SIGNAL(undoTextChanged(QString)));
        disconnect(d->active, SIGNAL(canRedoChanged(bool)),
                    this, SIGNAL(canRedoChanged(bool)));
        disconnect(d->active, SIGNAL(redoTextChanged(QString)),
                    this, SIGNAL(redoTextChanged(QString)));
        disconnect(d->active, SIGNAL(indexChanged(int)),
                    this, SIGNAL(indexChanged(int)));
        disconnect(d->active, SIGNAL(cleanChanged(bool)),
                    this, SIGNAL(cleanChanged(bool)));
    }

    d->active = stack;

    if (d->active == nullptr) {
        emit canUndoChanged(false);
        emit undoTextChanged(QString());
        emit canRedoChanged(false);
        emit redoTextChanged(QString());
        emit cleanChanged(true);
        emit indexChanged(0);
    } else {
        connect(d->active, SIGNAL(canUndoChanged(bool)),
                this, SIGNAL(canUndoChanged(bool)));
        connect(d->active, SIGNAL(undoTextChanged(QString)),
                this, SIGNAL(undoTextChanged(QString)));
        connect(d->active, SIGNAL(canRedoChanged(bool)),
                this, SIGNAL(canRedoChanged(bool)));
        connect(d->active, SIGNAL(redoTextChanged(QString)),
                this, SIGNAL(redoTextChanged(QString)));
        connect(d->active, SIGNAL(indexChanged(int)),
                this, SIGNAL(indexChanged(int)));
        connect(d->active, SIGNAL(cleanChanged(bool)),
                this, SIGNAL(cleanChanged(bool)));
        emit canUndoChanged(d->active->canUndo());
        emit undoTextChanged(d->active->undoText());
        emit canRedoChanged(d->active->canRedo());
        emit redoTextChanged(d->active->redoText());
        emit cleanChanged(d->active->isClean());
        emit indexChanged(d->active->index());
    }

    emit activeStackChanged(d->active);
}